

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::NoteNewRevision(cmCTestBZR *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *msg;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream cmCTestLog_msg;
  string local_30;
  cmCTestBZR *local_10;
  cmCTestBZR *this_local;
  
  local_10 = this;
  LoadInfo_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).NewRevision,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                           "Revision after update: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_cmCTestGlobalVC).NewRevision);
  std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"   New revision of repository is: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_cmCTestGlobalVC).NewRevision);
  std::operator<<(poVar1,"\n");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0xa9,msg,false);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  poVar1 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"URL = ");
  poVar1 = std::operator<<(poVar1,(string *)&this->URL);
  std::operator<<(poVar1,"\n");
  return true;
}

Assistant:

bool cmCTestBZR::NoteNewRevision()
{
  this->NewRevision = this->LoadInfo();
  this->Log << "Revision after update: " << this->NewRevision << "\n";
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   New revision of repository is: "
               << this->NewRevision << "\n");
  this->Log << "URL = " << this->URL << "\n";
  return true;
}